

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O3

obj * mkcorpstat(int objtype,monst *mtmp,permonst *ptr,level *lev,int x,int y,boolean init)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  uint uVar4;
  obj *obj;
  size_t sVar5;
  obj *poVar6;
  int iVar7;
  obj *otmp;
  long lVar8;
  
  if ((objtype != 0x10e) && (objtype != 0x215)) {
    warning("making corpstat type %d",(ulong)(uint)objtype);
  }
  obj = mksobj(lev,objtype,init,'\0');
  if (y == 0 && x == 0) {
    if (obj != (obj *)0x0) {
      rloco(obj);
      goto LAB_001e2e60;
    }
  }
  else {
    place_object(obj,lev,x,y);
    if (obj != (obj *)0x0) {
LAB_001e2e60:
      if (mtmp != (monst *)0x0) {
        if (ptr == (permonst *)0x0) {
          ptr = mtmp->data;
        }
        sVar2 = mtmp->mxlth;
        bVar1 = mtmp->mnamelth;
        if (obj->onamelth == '\0') {
          lVar8 = (long)obj->oxlth;
          iVar7 = 0;
        }
        else {
          lVar8 = (long)obj->oxlth;
          sVar5 = strlen((char *)((long)obj->oextra + lVar8));
          iVar7 = (int)sVar5 + 1;
        }
        poVar6 = realloc_obj(obj,(int)sVar2 + (uint)bVar1 + 0x78,mtmp,iVar7,
                             (char *)((long)obj->oextra + lVar8));
        if ((poVar6 != (obj *)0x0) && (obj = poVar6, poVar6->oxlth != 0)) {
          if (mtmp->data != (permonst *)0x0) {
            iVar7 = monsndx(mtmp->data);
            poVar6[1].where = (char)(short)iVar7;
            poVar6[1].timed = (char)((ushort)(short)iVar7 >> 8);
          }
          *(undefined8 *)((long)&poVar6[1].cobj + 4) = 0;
          *(undefined8 *)poVar6->oextra = 0;
          *(undefined8 *)((long)&poVar6[1].nobj + 4) = 0;
          *(uint *)&poVar6->field_0x4a = *(uint *)&poVar6->field_0x4a & 0xff9fffff | 0x200000;
        }
      }
      if (ptr == (permonst *)0x0) {
        return obj;
      }
      iVar7 = obj->corpsenm;
      iVar3 = monsndx(ptr);
      obj->corpsenm = iVar3;
      uVar4 = weight(obj);
      obj->owt = uVar4;
      if (obj->otyp != 0x10e) {
        return obj;
      }
      if (((iVar7 != 0xa3) && (iVar7 != 0x154)) && (2 < iVar7 - 0x144U)) {
        if ((mons[iVar7].mlet != '.') && (mons[iVar7].mlet != '4' || 0xfffffffd < iVar7 - 0xffU)) {
          iVar7 = obj->corpsenm;
          if (((((long)iVar7 != 0xa3) && ((iVar7 != 0x154 && (2 < iVar7 - 0x144U)))) &&
              (0xfffffffd < iVar7 - 0xffU || mons[iVar7].mlet != '4')) && (mons[iVar7].mlet != '.'))
          {
            return obj;
          }
        }
      }
      obj_stop_timers(obj);
      start_corpse_timeout(obj);
      return obj;
    }
  }
  return (obj *)0x0;
}

Assistant:

struct obj *mkcorpstat(int objtype,	/* CORPSE or STATUE */
		       struct monst *mtmp,
		       const struct permonst *ptr,
		       struct level *lev,
		       int x, int y,
		       boolean init)
{
	struct obj *otmp;

	if (objtype != CORPSE && objtype != STATUE)
	    warning("making corpstat type %d", objtype);
	if (x == 0 && y == 0) {		/* special case - random placement */
		otmp = mksobj(lev, objtype, init, FALSE);
		if (otmp) rloco(otmp);
	} else
		otmp = mksobj_at(objtype, lev, x, y, init, FALSE);
	if (otmp) {
	    if (mtmp) {
		struct obj *otmp2;

		if (!ptr) ptr = mtmp->data;
		/* save_mtraits frees original data pointed to by otmp */
		otmp2 = save_mtraits(otmp, mtmp);
		if (otmp2) otmp = otmp2;
	    }
	    /* use the corpse or statue produced by mksobj() as-is
	       unless `ptr' is non-null */
	    if (ptr) {
		int old_corpsenm = otmp->corpsenm;

		otmp->corpsenm = monsndx(ptr);
		otmp->owt = weight(otmp);
		if (otmp->otyp == CORPSE &&
			(special_corpse(old_corpsenm) ||
				special_corpse(otmp->corpsenm))) {
		    obj_stop_timers(otmp);
		    start_corpse_timeout(otmp);
		}
	    }
	}
	return otmp;
}